

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_log.c
# Opt level: O2

int mpt_connection_log(mpt_connection *con,char *from,int type,char *msg)

{
  int iVar1;
  long lVar3;
  ulong uVar4;
  int iVar5;
  size_t len;
  int8_t hdr [4];
  int local_38;
  size_t sVar2;
  
  if (((con->out).state & 0x10) == 0) {
    hdr[0] = '\0';
    hdr[1] = (byte)type & 0x7f;
    len = 2;
    local_38 = 0;
    if (from == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      sVar2 = strlen(from);
      iVar1 = (int)sVar2;
      if (((uint)type >> 0xb & 1) != 0) {
        hdr[2] = '\x01';
        len = 3;
      }
    }
    if (msg == (char *)0x0) {
      lVar3 = 0x100;
    }
    else {
      sVar2 = strlen(msg);
      local_38 = (int)sVar2;
      lVar3 = 0xfe;
    }
    if ((long)iVar1 < (long)(lVar3 - len)) {
      uVar4 = mpt_connection_push(con,len,hdr);
      if (-1 < (long)uVar4) {
        iVar5 = 0x100 - (int)len;
        if (from != (char *)0x0) {
          mpt_connection_push(con,(long)iVar1,from);
          iVar5 = iVar5 - iVar1;
        }
        if (msg != (char *)0x0) {
          hdr[0] = '\x02';
          mpt_connection_push(con,1,hdr);
          iVar5 = iVar5 + -1;
          if (local_38 < iVar5) {
            mpt_connection_push(con,(long)local_38,msg);
            hdr[0] = '\x03';
            mpt_connection_push(con,1,hdr);
          }
          else {
            mpt_connection_push(con,(long)iVar5,msg);
            iVar5 = 0;
          }
        }
        mpt_connection_push(con,0,(void *)0x0);
        uVar4 = (ulong)(2 - (iVar5 == 0));
      }
    }
    else {
      uVar4 = 0xffffffffffffffef;
    }
    return (int)uVar4;
  }
  return -0x21;
}

Assistant:

extern int mpt_connection_log(MPT_STRUCT(connection) *con, const char *from, int type, const char *msg)
{
	int8_t hdr[4];
	int flen, mlen, len;
	ssize_t ret;
	
	/* send log entry to contact */
	if ((con->out.state & MPT_OUTFLAG(Active))) {
		return MPT_MESGERR(InProgress);
	}
	hdr[0] = MPT_MESGTYPE(Output);
	hdr[1] = type & 0x7f;
	
	len = 2;
	mlen = flen = 0;
	if (from) {
		flen = strlen(from);
		if (type & MPT_ENUM(LogFunction)) {
			hdr[len++] = 0x1; /* SOH */
		}
	}
	ret = MPT_OUTPUT_LOGMSG_MAX;
	if (msg) {
		mlen = strlen(msg);
		ret -= 2;
	}
	if (flen >= (ret - len)) {
		return MPT_ERROR(MissingBuffer);
	}
	if ((ret = mpt_connection_push(con, len, hdr)) < 0) {
		return ret;
	}
	len = MPT_OUTPUT_LOGMSG_MAX - len;
	if (from) {
		mpt_connection_push(con, flen, from);
		len -= flen;
	}
	if (msg) {
		*hdr = 0x2; /* STX */
		mpt_connection_push(con, 1, hdr);
		--len;
		
		if (len > mlen) {
			mpt_connection_push(con, mlen, msg);
			*hdr = 0x3; /* ETX */
			mpt_connection_push(con, 1, hdr);
		} else {
			mpt_connection_push(con, len, msg);
			len = 0;
		}
	}
	mpt_connection_push(con, 0, 0);
	
	return len ? 2 : 1;
}